

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

int Aig_ManCheckAcyclic_rec(Aig_Man_t *p,Aig_Obj_t *pNode,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t **ppAVar3;
  uint uVar4;
  ulong uVar5;
  char *format;
  int iVar6;
  Aig_Man_t *pAVar7;
  Aig_Obj_t *pAVar8;
  
  uVar1 = (uint)*(undefined8 *)&pNode->field_0x18;
  uVar4 = uVar1 & 7;
  if (uVar4 == 2) {
    return 1;
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  if (uVar4 == 1) {
    return 1;
  }
  if ((uVar1 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x107,"int Aig_ManCheckAcyclic_rec(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  iVar6 = p->nTravIds;
  iVar2 = iVar6 + -1;
  if (iVar2 == pNode->TravId) {
    __assert_fail("!Aig_ObjIsTravIdPrevious(p, pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                  ,0x109,"int Aig_ManCheckAcyclic_rec(Aig_Man_t *, Aig_Obj_t *, int)");
  }
  if (pNode->TravId == iVar6) {
    if (fVerbose == 0) {
      return 0;
    }
    Abc_Print((int)p,"Network \"%s\" contains combinational loop!\n",p->pSpec);
    iVar6 = (int)p;
    uVar5 = (ulong)(uint)pNode->Id;
    format = "Node \"%d\" is encountered twice on the following path to the COs:\n";
    goto LAB_005e9308;
  }
  pNode->TravId = iVar6;
  pAVar8 = (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe);
  if (iVar2 == pAVar8->TravId) {
LAB_005e9263:
    pAVar8 = (Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
    if (iVar2 == pAVar8->TravId) {
LAB_005e9283:
      if (((p->pReprs == (Aig_Obj_t **)0x0) || (p->pReprs[pNode->Id] == (Aig_Obj_t *)0x0)) &&
         (ppAVar3 = p->pEquivs, ppAVar3 != (Aig_Obj_t **)0x0)) {
        iVar6 = pNode->Id;
        while (pAVar8 = ppAVar3[iVar6], pAVar8 != (Aig_Obj_t *)0x0) {
          if (p->nTravIds + -1 != pAVar8->TravId) {
            pAVar7 = p;
            iVar2 = Aig_ManCheckAcyclic_rec(p,pAVar8,fVerbose);
            iVar6 = (int)pAVar7;
            if (iVar2 == 0) {
              if (fVerbose == 0) {
                return 0;
              }
              Abc_Print(iVar6," %d",(ulong)(uint)pAVar8->Id);
              uVar5 = (ulong)(uint)pNode->Id;
              format = " (choice of %d) -> ";
              goto LAB_005e9308;
            }
            ppAVar3 = p->pEquivs;
          }
          if (ppAVar3 == (Aig_Obj_t **)0x0) break;
          iVar6 = pAVar8->Id;
        }
      }
      pNode->TravId = p->nTravIds + -1;
      return 1;
    }
    pAVar7 = p;
    iVar2 = Aig_ManCheckAcyclic_rec(p,pAVar8,fVerbose);
    iVar6 = (int)pAVar7;
    if (iVar2 != 0) goto LAB_005e9283;
  }
  else {
    pAVar7 = p;
    iVar2 = Aig_ManCheckAcyclic_rec(p,pAVar8,fVerbose);
    iVar6 = (int)pAVar7;
    if (iVar2 != 0) {
      iVar2 = p->nTravIds + -1;
      goto LAB_005e9263;
    }
  }
  if (fVerbose == 0) {
    return 0;
  }
  uVar5 = (ulong)(uint)pAVar8->Id;
  format = " %d ->";
LAB_005e9308:
  Abc_Print(iVar6,format,uVar5);
  return 0;
}

Assistant:

int Aig_ManCheckAcyclic_rec( Aig_Man_t * p, Aig_Obj_t * pNode, int fVerbose )
{
    Aig_Obj_t * pFanin;
    int fAcyclic;
    if ( Aig_ObjIsCi(pNode) || Aig_ObjIsConst1(pNode) )
        return 1;
    assert( Aig_ObjIsNode(pNode) );
    // make sure the node is not visited
    assert( !Aig_ObjIsTravIdPrevious(p, pNode) );
    // check if the node is part of the combinational loop
    if ( Aig_ObjIsTravIdCurrent(p, pNode) )
    {
        if ( fVerbose )
            Abc_Print( 1, "Network \"%s\" contains combinational loop!\n", p->pSpec? p->pSpec : NULL );
        if ( fVerbose )
        Abc_Print( 1, "Node \"%d\" is encountered twice on the following path to the COs:\n", Aig_ObjId(pNode) );
        return 0;
    }
    // mark this node as a node on the current path
    Aig_ObjSetTravIdCurrent( p, pNode );

    // visit the transitive fanin
    pFanin = Aig_ObjFanin0(pNode);
    // check if the fanin is visited
    if ( !Aig_ObjIsTravIdPrevious(p, pFanin) ) 
    {
        // traverse the fanin's cone searching for the loop
        if ( !(fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
        {
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d ->", Aig_ObjId(pFanin) );
            return 0;
        }
    }

    // visit the transitive fanin
    pFanin = Aig_ObjFanin1(pNode);
    // check if the fanin is visited
    if ( !Aig_ObjIsTravIdPrevious(p, pFanin) ) 
    {
        // traverse the fanin's cone searching for the loop
        if ( !(fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
        {
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d ->", Aig_ObjId(pFanin) );
            return 0;
        }
    }

    // visit choices
    if ( Aig_ObjRepr(p, pNode) == NULL && Aig_ObjEquiv(p, pNode) != NULL )
    {
        for ( pFanin = Aig_ObjEquiv(p, pNode); pFanin; pFanin = Aig_ObjEquiv(p, pFanin) )
        {
            // check if the fanin is visited
            if ( Aig_ObjIsTravIdPrevious(p, pFanin) ) 
                continue;
            // traverse the fanin's cone searching for the loop
            if ( (fAcyclic = Aig_ManCheckAcyclic_rec(p, pFanin, fVerbose)) )
                continue;
            // return as soon as the loop is detected
            if ( fVerbose )
            Abc_Print( 1, " %d", Aig_ObjId(pFanin) );
            if ( fVerbose )
            Abc_Print( 1, " (choice of %d) -> ", Aig_ObjId(pNode) );
            return 0;
        }
    }
    // mark this node as a visited node
    Aig_ObjSetTravIdPrevious( p, pNode );
    return 1;
}